

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O0

void __thiscall EventLoop::add_task(EventLoop *this,Task *cb)

{
  bool bVar1;
  log_level lVar2;
  Logger *pLVar3;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  Task *cb_local;
  EventLoop *this_local;
  
  lock._M_device = (mutex_type *)cb;
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","add_task",0x2c);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp"
                      ,"add_task",0x2c,LOG_LEVEL_INFO,"eventloop, add one task\n");
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  bVar1 = is_in_loop_thread(this);
  if (bVar1) {
    std::function<void_()>::operator()((function<void_()> *)lock._M_device);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard(&local_20,&this->el_mutex);
    std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::function<void()>>
              ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
               &this->el_task_funcs,(function<void_()> *)lock._M_device);
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
  }
  bVar1 = is_in_loop_thread(this);
  if ((!bVar1) || ((this->el_dealing_task_funcs & 1U) != 0)) {
    evfd_wakeup(this);
  }
  return;
}

Assistant:

void EventLoop::add_task(Task&& cb) {
LOG_INFO("eventloop, add one task\n");
    if (is_in_loop_thread())
    {
        cb();
    }
    else
    {
        lock_guard<mutex> lock(el_mutex);
        el_task_funcs.emplace_back(move(cb));       
    }

    if (!is_in_loop_thread() || el_dealing_task_funcs) { evfd_wakeup(); }
}